

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack10_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  
  uVar1 = *(ulong *)(in + 1);
  auVar8 = vpmovsxbd_avx2(ZEXT816(0x1010000000a0908));
  uVar2 = in[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar6 = vpsllvd_avx2(auVar9,_DAT_00193cd0);
  auVar7._8_4_ = 0x3fc;
  auVar7._0_8_ = 0x3f0000003fc;
  auVar7._12_4_ = 0x3f0;
  auVar6 = vpandq_avx512vl(auVar6,auVar7);
  auVar7 = vpbroadcastd_avx512vl();
  *out = *in & 0x3ff;
  uVar3 = in[3];
  auVar8 = vpermi2d_avx512vl(auVar8,ZEXT832(uVar1),ZEXT1632(auVar7));
  auVar4 = vpsrlvd_avx2(auVar8,_DAT_0018df40);
  auVar11._8_4_ = 0x3ff;
  auVar11._0_8_ = 0x3ff000003ff;
  auVar11._12_4_ = 0x3ff;
  auVar8._16_4_ = 0x3ff;
  auVar8._0_16_ = auVar11;
  auVar8._20_4_ = 0x3ff;
  auVar8._24_4_ = 0x3ff;
  auVar8._28_4_ = 0x3ff;
  auVar10._0_8_ = auVar6._0_8_;
  auVar10._8_8_ = auVar10._0_8_;
  auVar10._16_8_ = auVar10._0_8_;
  auVar10._24_8_ = auVar10._0_8_;
  auVar8 = vpand_avx2(auVar4,auVar8);
  auVar4 = vpor_avx2(auVar4,auVar10);
  auVar6 = vpinsrd_avx(auVar11,(uVar3 & 0xf) << 6,0);
  auVar8 = vpblendd_avx2(auVar8,auVar4,0x24);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar7 = vpshufd_avx(auVar9,0x55);
  auVar7 = vpinsrd_avx(auVar7,uVar3,1);
  auVar7 = vpinsrd_avx(auVar7,uVar2 << 8,3);
  auVar9 = vpinsrd_avx(auVar6,uVar3 >> 0x18,3);
  auVar6 = vpshufd_avx(auVar7,0xd4);
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_0019dea0);
  auVar5._8_4_ = 0x300;
  auVar5._0_8_ = 0x30000000300;
  auVar5._12_4_ = 0x300;
  auVar7 = vpandd_avx512vl(auVar7,auVar5);
  auVar7 = vpblendd_avx2(auVar6,auVar7,8);
  auVar6 = vpand_avx(auVar6,auVar11);
  auVar7 = vpor_avx(auVar7,auVar9);
  auVar6 = vpblendd_avx2(auVar7,auVar6,6);
  *(undefined1 (*) [16])(out + 9) = auVar6;
  auVar6 = vpbroadcastd_avx512vl();
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_00193550);
  auVar6 = vpand_avx(auVar6,auVar11);
  *(long *)(out + 0xd) = auVar6._0_8_;
  out[0xf] = uVar2 >> 0x16;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack10_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;
  *out = ((*in) >> 16) % (1U << 10);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 4)) << (10 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 10);
  out++;
  *out = ((*in) >> 14) % (1U << 10);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 2)) << (10 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 10);
  out++;
  *out = ((*in) >> 12) % (1U << 10);
  out++;
  *out = ((*in) >> 22);
  ++in;
  out++;

  return in;
}